

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

bool costScaleOk(vector<double,_std::allocator<double>_> *cost,HighsInt cost_scale,
                double infinite_cost)

{
  size_type sVar1;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar2;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  HighsInt iCol;
  double cost_scale_value;
  int local_2c;
  
  if (in_ESI != 0) {
    std::pow<int,int>(0,0x4f8712);
    for (local_2c = 0; sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI),
        local_2c < (int)sVar1; local_2c = local_2c + 1) {
      pvVar2 = in_RDI;
      std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_2c);
      std::abs((int)pvVar2);
      if (extraout_XMM0_Qa < INFINITY) {
        pvVar2 = in_RDI;
        std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)local_2c);
        std::abs((int)pvVar2);
        if (in_XMM0_Qa < extraout_XMM0_Qa_00) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool costScaleOk(const vector<double>& cost, const HighsInt cost_scale,
                 const double infinite_cost) {
  if (!cost_scale) return true;
  double cost_scale_value = std::pow(2, cost_scale);
  for (HighsInt iCol = 0; iCol < HighsInt(cost.size()); iCol++)
    if (std::abs(cost[iCol]) < kHighsInf &&
        std::abs(cost[iCol] * cost_scale_value) > infinite_cost)
      return false;
  return true;
}